

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

QByteArray * QFileSystemEngine::id(QByteArray *__return_storage_ptr__,QFileSystemEntry *entry)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_d8;
  stat64 statResult;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QFileSystemEntry::isEmpty(entry);
  if ((bVar2) || (bVar2 = qIsFilenameBroken(entry), bVar2)) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    memset(&statResult,0xaa,0x90);
    QFileSystemEntry::nativeFilePath((NativePath *)&QStack_d8,entry);
    if (QStack_d8.ptr == (char *)0x0) {
      QStack_d8.ptr = "";
    }
    iVar3 = stat64(QStack_d8.ptr,(stat64 *)&statResult);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_d8);
    if (iVar3 == 0) {
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::number(__return_storage_ptr__,statResult.st_dev,0x10);
      QByteArray::append(__return_storage_ptr__,':');
      QByteArray::number((QByteArray *)&QStack_d8,statResult.st_ino,10);
      QByteArray::append(__return_storage_ptr__,(QByteArray *)&QStack_d8);
      QArrayDataPointer<char>::~QArrayDataPointer(&QStack_d8);
    }
    else {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QFileSystemEngine::id(const QFileSystemEntry &entry)
{
    Q_CHECK_FILE_NAME(entry, QByteArray());

    QT_STATBUF statResult;
    if (QT_STAT(entry.nativeFilePath().constData(), &statResult)) {
        if (errno != ENOENT)
            qErrnoWarning("stat() failed for '%s'", entry.nativeFilePath().constData());
        return QByteArray();
    }
    QByteArray result = QByteArray::number(quint64(statResult.st_dev), 16);
    result += ':';
    result += QByteArray::number(quint64(statResult.st_ino));
    return result;
}